

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O0

int done_in_by_format(monst *mtmp,char *buf)

{
  boolean bVar1;
  byte bVar2;
  int iVar3;
  obj *poVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  char *killer_mon;
  boolean distorted;
  int kfmt;
  char *buf_local;
  monst *mtmp_local;
  
  bVar8 = false;
  if ((u.uprops[0x23].intrinsic == 0) || (bVar8 = false, u.uprops[0x24].extrinsic != 0))
  goto LAB_001cf18b;
  if (u.umonnum != u.umonster) {
    bVar1 = dmgtype(youmonst.data,0x24);
    bVar8 = false;
    if (bVar1 != '\0') goto LAB_001cf18b;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001cef10;
    if ((((u.uprops[0x1e].intrinsic == 0) &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
       (((u.uprops[0x40].intrinsic != 0 ||
         ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
        ((mtmp->data->mflags3 & 0x200) != 0)))) {
      bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x001cef0a;
    }
  }
  else {
    bVar2 = worm_known(level,mtmp);
joined_r0x001cef0a:
    if (bVar2 != 0) {
LAB_001cef10:
      if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
         ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
           ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)) &&
          (bVar8 = true, ((byte)u._1052_1_ >> 5 & 1) == 0)))) goto LAB_001cf18b;
    }
  }
  if (((mtmp->data->mflags1 & 0x10000) == 0) &&
     ((poVar4 = which_armor(mtmp,4), poVar4 == (obj *)0x0 ||
      (poVar4 = which_armor(mtmp,4), poVar4->otyp != 0x4f)))) {
    if ((((u.uprops[0x1e].intrinsic != 0) ||
         (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
          (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
        (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
         ((((u.uprops[0x19].intrinsic != 0 ||
            ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
           (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)))))) &&
       (bVar8 = true, u.uprops[0x19].blocked == 0)) goto LAB_001cf18b;
    if ((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) {
      iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
      bVar8 = true;
      if (iVar3 < 0x41) goto LAB_001cf18b;
    }
  }
  bVar8 = true;
  if ((u.uprops[0x42].intrinsic == 0) && (bVar8 = true, u.uprops[0x42].extrinsic == 0)) {
    bVar1 = match_warn_of_mon(mtmp);
    bVar8 = bVar1 != '\0';
  }
LAB_001cf18b:
  *buf = '\0';
  killer_mon._4_4_ = 0;
  if (((mtmp->data->geno & 0x1000) != 0) &&
     ((mtmp->data != mons + 0x120 || ((*(uint *)&mtmp->field_0x60 >> 0x1c & 1) != 0)))) {
    if ((mtmp->data->mflags2 & 0x80000) == 0) {
      strcat(buf,"the ");
    }
    killer_mon._4_4_ = 1;
  }
  if ((mtmp->data == mons + 0x12a) && (mtmp->mnamelth != '\0')) {
    strcat(buf,"the ");
    killer_mon._4_4_ = 1;
  }
  if ((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) {
    strcat(buf,"invisible ");
  }
  if (bVar8) {
    strcat(buf,"hallucinogen-distorted ");
  }
  if (mtmp->data == mons + 0x12a) {
    strcat(buf,"ghost");
    if (mtmp->mnamelth != '\0') {
      pcVar5 = eos(buf);
      sprintf(pcVar5," of %s",(undefined1 *)((long)(mtmp->mtrack + 0x18) + (long)(int)mtmp->mxlth));
    }
  }
  else if ((*(uint *)&mtmp->field_0x60 >> 0x19 & 1) == 0) {
    if (((*(uint *)&mtmp->field_0x60 >> 0x1c & 1) == 0) &&
       ((*(uint *)&mtmp->field_0x60 >> 0x1a & 1) == 0)) {
      pcVar5 = mons_mname(mtmp->data);
      strcat(buf,pcVar5);
      if (mtmp->mnamelth != '\0') {
        pcVar5 = eos(buf);
        sprintf(pcVar5," called %s",
                (undefined1 *)((long)(mtmp->mtrack + 0x18) + (long)(int)mtmp->mxlth));
      }
    }
    else {
      pcVar5 = m_monnam(mtmp);
      strcat(buf,pcVar5);
    }
  }
  else {
    pcVar5 = eos(buf);
    pcVar6 = "Mr.";
    if ((*(uint *)&mtmp->field_0x60 & 1) != 0) {
      pcVar6 = "Ms.";
    }
    pcVar7 = shkname(mtmp);
    sprintf(pcVar5,"%s %s, the shopkeeper",pcVar6,pcVar7);
    killer_mon._4_4_ = 1;
  }
  if (multi != 0) {
    if (multi_txt[0] == '\0') {
      strcat(buf,", while helpless");
    }
    else {
      pcVar5 = eos(buf);
      sprintf(pcVar5,", while %s",multi_txt);
    }
  }
  return killer_mon._4_4_;
}

Assistant:

int done_in_by_format(const struct monst *mtmp, char *buf)
{
	int kfmt;
	boolean distorted = (boolean)(Hallucination && canspotmon(level, mtmp));

	buf[0] = '\0';
	kfmt = KILLED_BY_AN;
	/* "killed by the high priest of Crom" is okay, "killed by the high
	   priest" alone isn't */
	if ((mtmp->data->geno & G_UNIQ) != 0 && !(mtmp->data == &mons[PM_HIGH_PRIEST] && !mtmp->ispriest)) {
	    if (!type_is_pname(mtmp->data))
		strcat(buf, "the ");
	    kfmt = KILLED_BY;
	}
	/* _the_ <invisible> <distorted> ghost of Dudley */
	if (mtmp->data == &mons[PM_GHOST] && mtmp->mnamelth) {
		strcat(buf, "the ");
		kfmt = KILLED_BY;
	}
	if (mtmp->minvis)
		strcat(buf, "invisible ");
	if (distorted)
		strcat(buf, "hallucinogen-distorted ");

	if (mtmp->data == &mons[PM_GHOST]) {
		strcat(buf, "ghost");
		if (mtmp->mnamelth) sprintf(eos(buf), " of %s", NAME(mtmp));
	} else if (mtmp->isshk) {
		sprintf(eos(buf), "%s %s, the shopkeeper",
			(mtmp->female ? "Ms." : "Mr."), shkname(mtmp));
		kfmt = KILLED_BY;
	} else if (mtmp->ispriest || mtmp->isminion) {
		/* m_monnam() suppresses "the" prefix plus "invisible", and
		   it overrides the effect of Hallucination on priestname() */
		const char *killer_mon = m_monnam(mtmp);
		strcat(buf, killer_mon);
	} else {
		strcat(buf, mons_mname(mtmp->data));
		if (mtmp->mnamelth)
		    sprintf(eos(buf), " called %s", NAME(mtmp));
	}

	if (multi) {
	    if (*multi_txt)
		sprintf(eos(buf), ", while %s", multi_txt);
	    else
		strcat(buf, ", while helpless");
	}

	return kfmt;
}